

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O2

void __thiscall UnitTests::Assert::True(Assert *this,bool expr)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  True(this,&local_38,expr);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void True(bool expr) const
        {
            True("", expr);
        }